

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O2

void Abc_TruthNpnPerform(Abc_TtStore_t *p,int NpnType,int fVerbose)

{
  uint uVar1;
  abctime aVar2;
  permInfo *x;
  Abc_TtHieMan_t *p_00;
  abctime aVar3;
  int iVar4;
  char *pcVar5;
  word *pTruth;
  char *pcVar6;
  code *func;
  int flag;
  ulong uVar7;
  char pCanonPerm [16];
  uint pAux [2048];
  word pAuxWord1 [1024];
  
  aVar2 = Abc_Clock();
  if (NpnType == 0) {
    pcVar6 = "uniqifying          ";
LAB_002987ab:
    if (0x10 < p->nVars) {
LAB_00298e05:
      __assert_fail("p->nVars <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpn.c"
                    ,0xd4,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
    pcVar5 = "s";
    if (p->nFuncs == 1) {
      pcVar5 = "";
    }
    printf("Applying %-20s to %8d func%s of %2d vars...  ",pcVar6,(ulong)(uint)p->nFuncs,pcVar5);
  }
  else {
    if ((uint)NpnType < 0xc) {
      pcVar6 = &DAT_00787d7c + *(int *)(&DAT_00787d78 + (long)NpnType * 4);
      goto LAB_002987ab;
    }
    if (0x10 < p->nVars) goto LAB_00298e05;
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  if (NpnType == 0) {
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        putchar(10);
      }
    }
    goto LAB_00298d9e;
  }
  switch(NpnType) {
  case 1:
    Abc_TruthNpnCountUnique(p);
    x = setPermInfoPtr(p->nVars);
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose == 0) {
        simpleMinimal(p->pFuncs[uVar7],(word *)pAux,pAuxWord1,x,p->nVars);
      }
      else {
        printf("%7d : ",uVar7 & 0xffffffff);
        simpleMinimal(p->pFuncs[uVar7],(word *)pAux,pAuxWord1,x,p->nVars);
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(pCanonPerm,0,p->nVars);
        putchar(10);
      }
    }
    freePermInfoPtr(x);
    break;
  case 2:
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      resetPCanonPermArray(pCanonPerm,p->nVars);
      uVar1 = Kit_TruthSemiCanonicize((uint *)p->pFuncs[uVar7],pAux,p->nVars,pCanonPerm);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
        putchar(10);
      }
    }
    break;
  case 3:
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      resetPCanonPermArray(pCanonPerm,p->nVars);
      uVar1 = luckyCanonicizer_final_fast(p->pFuncs[uVar7],p->nVars,pCanonPerm);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
        putchar(10);
      }
    }
    break;
  case 4:
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      resetPCanonPermArray(pCanonPerm,p->nVars);
      uVar1 = luckyCanonicizer_final_fast1(p->pFuncs[uVar7],p->nVars,pCanonPerm);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
        putchar(10);
      }
    }
    break;
  case 5:
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      uVar1 = Abc_TtCanonicize(p->pFuncs[uVar7],p->nVars,pCanonPerm);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
        putchar(10);
      }
    }
    break;
  case 6:
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      uVar1 = Abc_TtCanonicizePhase(p->pFuncs[uVar7],p->nVars);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint((char *)0x0,uVar1,p->nVars);
        putchar(10);
      }
    }
    break;
  case 7:
    p_00 = Abc_TtHieManStart(p->nVars,5);
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose == 0) {
        Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar7],p->nVars,pCanonPerm,0);
      }
      else {
        printf("%7d : ",uVar7 & 0xffffffff);
        Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar7],p->nVars,pCanonPerm,0);
        putchar(10);
      }
    }
    goto LAB_00298d99;
  case 8:
    p_00 = Abc_TtHieManStart(p->nVars,5);
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      uVar1 = Abc_TtCanonicizeWrap
                        (Abc_TtCanonicizeAda,p_00,p->pFuncs[uVar7],p->nVars,pCanonPerm,0x7d);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
        putchar(10);
      }
    }
    goto LAB_00298d99;
  default:
    if (2 < NpnType - 9U) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpn.c"
                    ,0x167,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
    p_00 = Abc_TtHieManStart(p->nVars,5);
    uVar1 = 0;
    for (uVar7 = 0; (long)uVar7 < (long)p->nFuncs; uVar7 = uVar7 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      if (NpnType == 0xb) {
        pTruth = p->pFuncs[uVar7];
        iVar4 = p->nVars;
        func = Abc_TtCanonicizeCA;
        flag = 1;
LAB_00298d54:
        uVar1 = Abc_TtCanonicizeWrap(func,p_00,pTruth,iVar4,pCanonPerm,flag);
      }
      else {
        if (NpnType == 10) {
          pTruth = p->pFuncs[uVar7];
          iVar4 = p->nVars;
          func = Abc_TtCanonicizeAda;
          flag = 0x4af;
          goto LAB_00298d54;
        }
        if (NpnType == 9) {
          pTruth = p->pFuncs[uVar7];
          iVar4 = p->nVars;
          func = Abc_TtCanonicizeAda;
          flag = 0x7d;
          goto LAB_00298d54;
        }
      }
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
        putchar(10);
      }
    }
LAB_00298d99:
    Abc_TtHieManStop(p_00);
  }
LAB_00298d9e:
  aVar3 = Abc_Clock();
  uVar1 = Abc_TruthNpnCountUnique(p);
  iVar4 = 0x788050;
  printf("Classes =%9d  ",(ulong)uVar1);
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthNpnPerform( Abc_TtStore_t * p, int NpnType, int fVerbose )
{
    unsigned pAux[2048];
    word pAuxWord[1024], pAuxWord1[1024];
    char pCanonPerm[16];
    unsigned uCanonPhase=0;
    abctime clk = Abc_Clock();
    int i;

    char * pAlgoName = NULL;
    if ( NpnType == 0 )
        pAlgoName = "uniqifying          ";
    else if ( NpnType == 1 )
        pAlgoName = "exact NPN           ";
    else if ( NpnType == 2 )
        pAlgoName = "counting 1s         ";
    else if ( NpnType == 3 )
        pAlgoName = "Jake's hybrid fast  ";
    else if ( NpnType == 4 )
        pAlgoName = "Jake's hybrid good  ";
    else if ( NpnType == 5 )
        pAlgoName = "new hybrid fast     ";
    else if ( NpnType == 6 )
        pAlgoName = "new phase flipping  ";
    else if ( NpnType == 7 )
        pAlgoName = "new hier. matching  ";
    else if ( NpnType == 8 )
        pAlgoName = "new adap. matching  ";
    else if ( NpnType == 9 )
        pAlgoName = "adjustable algorithm (heuristic) ";
    else if ( NpnType == 10 )
        pAlgoName = "adjustable algorithm (exact)     ";
    else if ( NpnType == 11 )
        pAlgoName = "new cost-aware exact algorithm   ";

    assert( p->nVars <= 16 );
    if ( pAlgoName )
        printf( "Applying %-20s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( NpnType == 0 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), printf( "\n" );
        }
    }
    else if ( NpnType == 1 )
    {
        permInfo* pi; 
        Abc_TruthNpnCountUnique(p);
        pi = setPermInfoPtr(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            simpleMinimal(p->pFuncs[i], pAuxWord, pAuxWord1, pi, p->nVars);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
        freePermInfoPtr(pi);
    }
    else if ( NpnType == 2 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pFuncs[i], pAux, p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 3 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 4 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast1( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicize( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 6 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizePhase( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 7 )
    {
        int fExact = 0;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart( p->nVars, 5 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeHie( pMan, p->pFuncs[i], p->nVars, pCanonPerm, fExact );
            if ( fVerbose )
//                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
                printf( "\n" );
        }
        // nClasses = Abc_TtManNumClasses( pMan );
		Abc_TtHieManStop( pMan );
    }
    else if ( NpnType == 8 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		int fHigh = 1, iEnumThres = 25;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, fHigh*100 + iEnumThres);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else if ( NpnType == 9 || NpnType == 10 || NpnType == 11 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
        unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( NpnType == 9 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm,  125); // -A 8, adjustable algorithm (heuristic)
            else if ( NpnType == 10 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, 1199); // -A 9, adjustable algorithm (exact)
            else if ( NpnType == 11 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeCA,  pMan, p->pFuncs[i], p->nVars, pCanonPerm,    1); // -A 10, new cost-aware exact algorithm
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else assert( 0 );
    clk = Abc_Clock() - clk;
    printf( "Classes =%9d  ", Abc_TruthNpnCountUnique(p) );
    Abc_PrintTime( 1, "Time", clk );
}